

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O3

int nghttp2_http_on_header
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame,
              nghttp2_hd_nv *nv,int trailer)

{
  short sVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  nghttp2_rcbuf *pnVar4;
  int *piVar5;
  byte bVar6;
  uint8_t uVar7;
  int iVar8;
  uint uVar9;
  uint8_t *bb;
  int64_t iVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  bool bVar18;
  nghttp2_extpri nStack_38;
  
  iVar8 = nghttp2_check_header_name(nv->name->base,nv->name->len);
  if (iVar8 == 0) {
    pnVar4 = nv->name;
    if (pnVar4->len != 0) {
      if (*pnVar4->base == ':') {
        return -0x213;
      }
      sVar12 = 0;
      do {
        if (0xe5 < (byte)(pnVar4->base[sVar12] + 0xa5)) {
          return -0x213;
        }
        sVar12 = sVar12 + 1;
      } while (pnVar4->len != sVar12);
    }
    goto LAB_007397b4;
  }
  iVar8 = nv->token;
  switch(iVar8) {
  case 1:
    iVar8 = nghttp2_check_method(nv->value->base,nv->value->len);
    break;
  case 2:
  case 4:
switchD_007395e2_caseD_2:
    bVar6 = stream->flags;
LAB_007396b9:
    puVar2 = nv->value->base;
    sVar12 = nv->value->len;
    goto joined_r0x007396c7;
  case 3:
    iVar8 = nghttp2_check_path(nv->value->base,nv->value->len);
    break;
  case 5:
    sVar12 = nv->value->len;
    if ((sVar12 == 0) || (pbVar3 = nv->value->base, 0x19 < (byte)((*pbVar3 & 0xdf) + 0xbf)))
    goto LAB_00739794;
    if (sVar12 != 1) {
      sVar14 = 1;
      do {
        bVar6 = pbVar3[sVar14];
        if (((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) &&
           ((0x2e < bVar6 || ((0x680000000000U >> ((ulong)bVar6 & 0x3f) & 1) == 0))))
        goto LAB_00739794;
        sVar14 = sVar14 + 1;
      } while (sVar12 != sVar14);
    }
    goto LAB_0073977d;
  default:
    if (iVar8 != 0x25) {
      if (iVar8 != 0x42) goto switchD_007395e2_caseD_2;
      bVar6 = stream->flags;
      if ((bVar6 & 0x40) != 0) {
        sVar12 = nv->value->len;
        if (sVar12 != 0) {
          sVar14 = 0;
          do {
            uVar7 = nv->value->base[sVar14];
            if ((uVar7 != ' ') && (uVar7 != '\t')) goto LAB_007396b9;
            sVar14 = sVar14 + 1;
          } while (sVar12 != sVar14);
        }
        goto LAB_00739794;
      }
      goto LAB_007396b9;
    }
  case 0:
    if ((session->server == '\0') && ((frame->hd).type != '\x05')) {
      bVar6 = stream->flags;
      puVar2 = nv->value->base;
      sVar12 = nv->value->len;
joined_r0x007396c7:
      if ((bVar6 & 0x40) == 0) {
        iVar8 = nghttp2_check_header_value_rfc9113(puVar2,sVar12);
      }
      else {
        iVar8 = nghttp2_check_header_value(puVar2,sVar12);
      }
    }
    else {
      iVar8 = nghttp2_check_authority(nv->value->base,nv->value->len);
    }
  }
  if (iVar8 == 0) {
LAB_00739794:
    if (nv->name->len == 0) {
      __assert_fail("nv->name->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_http.c"
                    ,0x1a7,
                    "int nghttp2_http_on_header(nghttp2_session *, nghttp2_stream *, nghttp2_frame *, nghttp2_hd_nv *, int)"
                   );
    }
    if (*nv->name->base == ':') {
      return -0x213;
    }
LAB_007397b4:
    *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
    return -0x69;
  }
LAB_0073977d:
  if (session->server == '\0') {
    bVar18 = true;
    if ((frame->hd).type != '\x05') {
      puVar2 = nv->name->base;
      uVar7 = *puVar2;
      if (uVar7 == ':') {
        if (trailer != 0) {
          return -0x213;
        }
        if ((stream->http_flags & 0x40) != 0) {
          return -0x213;
        }
      }
      iVar8 = nv->token;
      if (iVar8 < 0x3d) {
        if (iVar8 == 7) {
          if ((stream->http_flags & 0x20) != 0) {
            return -0x213;
          }
          pnVar4 = nv->value;
          sVar12 = pnVar4->len;
          if (sVar12 == 0) {
            return -0x213;
          }
          stream->http_flags = stream->http_flags | 0x20;
          if (sVar12 != 3) {
            return -0x213;
          }
          lVar13 = 0;
          lVar11 = 0;
          do {
            bVar6 = pnVar4->base[lVar13];
            if (((byte)(bVar6 - 0x3a) < 0xf6) || (0xccccccccccccccc < lVar11)) {
LAB_00739e41:
              stream->status_code = -1;
              return -0x213;
            }
            uVar17 = (ulong)(bVar6 & 0xf);
            if ((long)(uVar17 ^ 0x7fffffffffffffff) < lVar11 * 10) goto LAB_00739e41;
            lVar11 = lVar11 * 10 + uVar17;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          stream->status_code = (short)lVar11;
          if ((short)lVar11 == 0x65) {
            return -0x213;
          }
          if (((uint)lVar11 & 0xffff) == 0xffff) {
            return -0x213;
          }
        }
        else {
          if (iVar8 != 0x1b) {
            if (iVar8 == 0x38) {
              return -0x213;
            }
            goto LAB_00739cfe;
          }
          sVar1 = stream->status_code;
          if (sVar1 == 0xcc) {
            if (stream->content_length != -1) {
              return -0x213;
            }
            if (nv->value->len == 1) {
              bVar6 = *nv->value->base;
              bVar15 = bVar6 | 0x20;
              if (0x19 < (byte)(bVar6 + 0xbf)) {
                bVar15 = bVar6;
              }
              if (bVar15 == 0x30) {
                stream->content_length = 0;
                return -0x6a;
              }
              return -0x213;
            }
            return -0x213;
          }
          if ((ushort)(sVar1 - 100U) < 100) {
            return -0x213;
          }
          if (((ushort)(sVar1 - 200U) < 100) && ((stream->http_flags & 0x80) != 0)) {
            return -0x6a;
          }
          if (stream->content_length != -1) {
            return -0x213;
          }
          iVar10 = parse_uint(nv->value->base,nv->value->len);
          stream->content_length = iVar10;
          if (iVar10 == -1) {
            return -0x213;
          }
        }
      }
      else {
        if (iVar8 - 0x3eU < 4) {
          return -0x213;
        }
        if (iVar8 == 0x3d) {
          if (nv->value->len != 8) {
            return -0x213;
          }
          lVar11 = 0;
          do {
            bVar6 = "trailers"[lVar11];
            bVar15 = bVar6 | 0x20;
            if (0x19 < (byte)(bVar6 + 0xbf)) {
              bVar15 = bVar6;
            }
            bVar6 = nv->value->base[lVar11];
            bVar16 = bVar6 | 0x20;
            if (0x19 < (byte)(bVar6 + 0xbf)) {
              bVar16 = bVar6;
            }
            if (bVar15 != bVar16) {
              return -0x213;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
        }
        else {
LAB_00739cfe:
          if (uVar7 == ':') {
            return -0x213;
          }
        }
      }
      if (*puVar2 == ':') {
        return 0;
      }
      goto LAB_00739df4;
    }
  }
  else {
    bVar18 = session->pending_enable_connect_protocol == '\0';
  }
  uVar7 = *nv->name->base;
  if (uVar7 == ':') {
    if (trailer != 0) {
      return -0x213;
    }
    if ((stream->http_flags & 0x40) != 0) {
      return -0x213;
    }
  }
  iVar8 = nv->token;
  if (iVar8 < 0x38) {
    switch(iVar8) {
    case 0:
      if ((stream->http_flags & 1) != 0) {
        return -0x213;
      }
      if (nv->value->len == 0) {
        return -0x213;
      }
      uVar9 = stream->http_flags | 1;
      break;
    case 1:
      uVar9 = stream->http_flags;
      if ((uVar9 & 4) != 0) {
        return -0x213;
      }
      pnVar4 = nv->value;
      sVar12 = pnVar4->len;
      if (sVar12 == 0) {
        return -0x213;
      }
      stream->http_flags = uVar9 | 4;
      if (sVar12 == 7) {
        piVar5 = (int *)pnVar4->base;
        if (*(char *)((long)piVar5 + 6) == 'S') {
          if (*(int *)((long)piVar5 + 3) == 0x534e4f49 && *piVar5 == 0x4954504f) {
            uVar9 = uVar9 | 0x204;
            break;
          }
        }
        else if ((*(char *)((long)piVar5 + 6) == 'T') &&
                (*(int *)((long)piVar5 + 3) == 0x5443454e && *piVar5 == 0x4e4e4f43)) {
          if ((stream->stream_id & 1) == 0) {
            return -0x213;
          }
          uVar9 = uVar9 | 0x84;
          break;
        }
        goto LAB_00739de6;
      }
      if ((sVar12 != 4) || (*(int *)pnVar4->base != 0x44414548)) goto LAB_00739de6;
      uVar9 = uVar9 | 0x104;
      break;
    case 2:
    case 4:
switchD_00739827_caseD_39:
      if (uVar7 == ':') {
        return -0x213;
      }
      goto LAB_00739de6;
    case 3:
      uVar9 = stream->http_flags;
      if ((uVar9 & 2) != 0) {
        return -0x213;
      }
      pnVar4 = nv->value;
      sVar12 = pnVar4->len;
      if (sVar12 == 0) {
        return -0x213;
      }
      stream->http_flags = uVar9 | 2;
      uVar7 = *pnVar4->base;
      if (uVar7 == '/') {
        uVar9 = uVar9 | 0x802;
      }
      else {
        if (uVar7 != '*' || sVar12 != 1) goto LAB_00739de6;
        uVar9 = uVar9 | 0x1002;
      }
      break;
    case 5:
      uVar9 = stream->http_flags;
      if ((uVar9 & 8) != 0) {
        return -0x213;
      }
      pnVar4 = nv->value;
      sVar12 = pnVar4->len;
      if (sVar12 == 0) {
        return -0x213;
      }
      stream->http_flags = uVar9 | 8;
      if (sVar12 == 5) {
        lVar11 = 0;
        do {
          bVar6 = "https"[lVar11];
          bVar15 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar15 = bVar6;
          }
          bVar6 = pnVar4->base[lVar11];
          bVar16 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar16 = bVar6;
          }
          if (bVar15 != bVar16) goto LAB_00739de6;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
      }
      else {
        if (sVar12 != 4) goto LAB_00739de6;
        lVar11 = 0;
        do {
          bVar6 = "http"[lVar11];
          bVar15 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar15 = bVar6;
          }
          bVar6 = pnVar4->base[lVar11];
          bVar16 = bVar6 | 0x20;
          if (0x19 < (byte)(bVar6 + 0xbf)) {
            bVar16 = bVar6;
          }
          if (bVar15 != bVar16) goto LAB_00739de6;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
      }
      uVar9 = uVar9 | 0x2008;
      break;
    default:
      if (iVar8 == 0x1b) {
        if (stream->content_length != -1) {
          return -0x213;
        }
        iVar10 = parse_uint(nv->value->base,nv->value->len);
        stream->content_length = iVar10;
        if (iVar10 == -1) {
          return -0x213;
        }
        goto LAB_00739de6;
      }
      if (iVar8 != 0x25) goto switchD_00739827_caseD_39;
      if ((stream->http_flags & 0x10) != 0) {
        return -0x213;
      }
      if (nv->value->len == 0) {
        return -0x213;
      }
      uVar9 = stream->http_flags | 0x10;
    }
LAB_00739de0:
    stream->http_flags = uVar9;
  }
  else {
    switch(iVar8) {
    case 0x38:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
      return -0x213;
    default:
      goto switchD_00739827_caseD_39;
    case 0x3d:
      if (nv->value->len != 8) {
        return -0x213;
      }
      lVar11 = 0;
      do {
        bVar6 = "trailers"[lVar11];
        bVar15 = bVar6 | 0x20;
        if (0x19 < (byte)(bVar6 + 0xbf)) {
          bVar15 = bVar6;
        }
        bVar6 = nv->value->base[lVar11];
        bVar16 = bVar6 | 0x20;
        if (0x19 < (byte)(bVar6 + 0xbf)) {
          bVar16 = bVar6;
        }
        if (bVar15 != bVar16) {
          return -0x213;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      break;
    case 0x42:
      if (bVar18) {
        return -0x213;
      }
      if ((short)stream->http_flags < 0) {
        return -0x213;
      }
      if (nv->value->len == 0) {
        return -0x213;
      }
      uVar9 = stream->http_flags | 0x8000;
      goto LAB_00739de0;
    case 0x43:
      if ((((trailer == 0) && ((stream->stream_id & 1) != 0)) && ((stream->flags & 0x10) != 0)) &&
         ((stream->http_flags & 0x20000) == 0)) {
        nghttp2_extpri_from_uint8(&nStack_38,stream->http_extpri);
        iVar8 = nghttp2_http_parse_priority(&nStack_38,nv->value->base,nv->value->len);
        if (iVar8 != 0) {
          uVar9 = stream->http_flags & 0xfffcffff | 0x20000;
          goto LAB_00739de0;
        }
        uVar7 = nghttp2_extpri_to_uint8(&nStack_38);
        stream->http_extpri = uVar7;
        pbVar3 = (byte *)((long)&stream->http_flags + 2);
        *pbVar3 = *pbVar3 | 1;
      }
    }
  }
LAB_00739de6:
  if (*nv->name->base == ':') {
    return 0;
  }
LAB_00739df4:
  *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
  return 0;
}

Assistant:

int nghttp2_http_on_header(nghttp2_session *session, nghttp2_stream *stream,
                           nghttp2_frame *frame, nghttp2_hd_nv *nv,
                           int trailer) {
  int rv;

  /* We are strict for pseudo header field.  One bad character should
     lead to fail.  OTOH, we should be a bit forgiving for regular
     headers, since existing public internet has so much illegal
     headers floating around and if we kill the stream because of
     this, we may disrupt many web sites and/or libraries.  So we
     become conservative here, and just ignore those illegal regular
     headers. */
  if (!nghttp2_check_header_name(nv->name->base, nv->name->len)) {
    size_t i;
    if (nv->name->len > 0 && nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* header field name must be lower-cased without exception */
    for (i = 0; i < nv->name->len; ++i) {
      uint8_t c = nv->name->base[i];
      if ('A' <= c && c <= 'Z') {
        return NGHTTP2_ERR_HTTP_HEADER;
      }
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  switch (nv->token) {
  case NGHTTP2_TOKEN__METHOD:
    rv = nghttp2_check_method(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PATH:
    rv = nghttp2_check_path(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__AUTHORITY:
  case NGHTTP2_TOKEN_HOST:
    if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
      rv = nghttp2_check_authority(nv->value->base, nv->value->len);
    } else if (
        stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
    break;
  case NGHTTP2_TOKEN__SCHEME:
    rv = check_scheme(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PROTOCOL:
    /* Check the value consists of just white spaces, which was done
       in check_pseudo_header before
       nghttp2_check_header_value_rfc9113 has been introduced. */
    if ((stream->flags &
         NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) &&
        lws(nv->value->base, nv->value->len)) {
      rv = 0;
      break;
    }
    /* fall through */
  default:
    if (stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
  }

  if (rv == 0) {
    assert(nv->name->len > 0);
    if (nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    return http_request_on_header(stream, nv, trailer,
                                  session->server &&
                                      session->pending_enable_connect_protocol);
  }

  return http_response_on_header(stream, nv, trailer);
}